

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O1

void cf2_hint_init(CF2_Hint hint,CF2_ArrStack stemHintArray,size_t indexStemHint,CF2_Font font,
                  CF2_F16Dot16 hintOrigin,CF2_F16Dot16 scale,FT_Bool bottom)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  bool bVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  
  hint->csCoord = 0;
  hint->dsCoord = 0;
  *(undefined8 *)&hint->scale = 0;
  *(undefined8 *)hint = 0;
  hint->index = 0;
  sVar5 = indexStemHint;
  if (stemHintArray->count <= indexStemHint) {
    piVar2 = stemHintArray->error;
    if ((piVar2 != (int *)0x0) && (*piVar2 == 0)) {
      *piVar2 = 0x82;
    }
    sVar5 = 0;
  }
  pvVar3 = stemHintArray->ptr;
  lVar6 = sVar5 * stemHintArray->sizeItem;
  iVar9 = *(int *)((long)pvVar3 + lVar6 + 4);
  iVar1 = *(int *)((long)pvVar3 + lVar6 + 8);
  iVar7 = iVar1 - iVar9;
  if (iVar7 == -0x140000) {
    if (bottom != '\0') {
LAB_001566b2:
      uVar8 = 0;
      bVar4 = true;
      goto LAB_001566f0;
    }
    hint->csCoord = iVar9;
    uVar8 = 2;
  }
  else if (iVar7 == -0x150000) {
    if (bottom == '\0') goto LAB_001566b2;
    hint->csCoord = iVar1;
    uVar8 = 1;
  }
  else {
    if (iVar7 < 0) {
      if (bottom == '\0') {
        hint->csCoord = iVar9;
        goto LAB_001566e8;
      }
      hint->csCoord = iVar1;
    }
    else {
      if (bottom == '\0') {
        hint->csCoord = iVar1;
LAB_001566e8:
        uVar8 = 8;
        goto LAB_001566ed;
      }
      hint->csCoord = iVar9;
    }
    uVar8 = 4;
  }
LAB_001566ed:
  bVar4 = false;
LAB_001566f0:
  hint->flags = uVar8;
  if ((uVar8 & 10) != 0) {
    hint->csCoord = hint->csCoord + font->darkenY * 2;
  }
  iVar9 = hintOrigin + hint->csCoord;
  hint->csCoord = iVar9;
  hint->scale = scale;
  hint->index = indexStemHint;
  if ((bVar4) || (*(char *)((long)pvVar3 + lVar6) == '\0')) {
    lVar6 = (long)scale * (long)iVar9;
    hint->dsCoord = (CF2_F16Dot16)((ulong)((lVar6 >> 0x3f) + lVar6 + 0x8000) >> 0x10);
  }
  else {
    hint->dsCoord =
         *(CF2_F16Dot16 *)((char *)((long)pvVar3 + lVar6) + (ulong)((uVar8 & 10) != 0) * 4 + 0xc);
    hint->flags = uVar8 | 0x10;
  }
  return;
}

Assistant:

static void
  cf2_hint_init( CF2_Hint            hint,
                 const CF2_ArrStack  stemHintArray,
                 size_t              indexStemHint,
                 const CF2_Font      font,
                 CF2_Fixed           hintOrigin,
                 CF2_Fixed           scale,
                 FT_Bool             bottom )
  {
    CF2_Fixed               width;
    const CF2_StemHintRec*  stemHint;


    FT_ZERO( hint );

    stemHint = (const CF2_StemHintRec*)cf2_arrstack_getPointer(
                                         stemHintArray,
                                         indexStemHint );

    width = SUB_INT32( stemHint->max, stemHint->min );

    if ( width == cf2_intToFixed( -21 ) )
    {
      /* ghost bottom */

      if ( bottom )
      {
        hint->csCoord = stemHint->max;
        hint->flags   = CF2_GhostBottom;
      }
      else
        hint->flags = 0;
    }

    else if ( width == cf2_intToFixed( -20 ) )
    {
      /* ghost top */

      if ( bottom )
        hint->flags = 0;
      else
      {
        hint->csCoord = stemHint->min;
        hint->flags   = CF2_GhostTop;
      }
    }

    else if ( width < 0 )
    {
      /* inverted pair */

      /*
       * Hints with negative widths were produced by an early version of a
       * non-Adobe font tool.  The Type 2 spec allows edge (ghost) hints
       * with negative widths, but says
       *
       *   All other negative widths have undefined meaning.
       *
       * CoolType has a silent workaround that negates the hint width; for
       * permissive mode, we do the same here.
       *
       * Note: Such fonts cannot use ghost hints, but should otherwise work.
       * Note: Some poor hints in our faux fonts can produce negative
       *       widths at some blends.  For example, see a light weight of
       *       `u' in ASerifMM.
       *
       */
      if ( bottom )
      {
        hint->csCoord = stemHint->max;
        hint->flags   = CF2_PairBottom;
      }
      else
      {
        hint->csCoord = stemHint->min;
        hint->flags   = CF2_PairTop;
      }
    }

    else
    {
      /* normal pair */

      if ( bottom )
      {
        hint->csCoord = stemHint->min;
        hint->flags   = CF2_PairBottom;
      }
      else
      {
        hint->csCoord = stemHint->max;
        hint->flags   = CF2_PairTop;
      }
    }

    /* Now that ghost hints have been detected, adjust this edge for      */
    /* darkening.  Bottoms are not changed; tops are incremented by twice */
    /* `darkenY'.                                                         */
    if ( cf2_hint_isTop( hint ) )
      hint->csCoord = ADD_INT32( hint->csCoord, 2 * font->darkenY );

    hint->csCoord = ADD_INT32( hint->csCoord, hintOrigin );
    hint->scale   = scale;
    hint->index   = indexStemHint;   /* index in original stem hint array */

    /* if original stem hint has been used, use the same position */
    if ( hint->flags != 0 && stemHint->used )
    {
      if ( cf2_hint_isTop( hint ) )
        hint->dsCoord = stemHint->maxDS;
      else
        hint->dsCoord = stemHint->minDS;

      cf2_hint_lock( hint );
    }
    else
      hint->dsCoord = FT_MulFix( hint->csCoord, scale );
  }